

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Datafile.cpp
# Opt level: O2

void __thiscall Datafile::commit(Datafile *this)

{
  pointer pbVar1;
  int iVar2;
  string *__return_storage_ptr__;
  int __oflag;
  __off_t __length;
  Datafile *__filename;
  pointer pbVar3;
  allocator<char> local_81;
  AtomicFile file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (this->_dirty == true) {
    __filename = this;
    AtomicFile::AtomicFile(&file,&this->_file);
    if ((this->_lines).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->_lines).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      AtomicFile::remove(&file,(char *)__filename);
    }
    else {
      iVar2 = AtomicFile::open(&file,(char *)__filename,__oflag);
      if ((char)iVar2 == '\0') {
        __return_storage_ptr__ = (string *)__cxa_allocate_exception(0x20);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,"Could not write to data file {1}",&local_81);
        std::__cxx11::string::string((string *)&local_50,(string *)&(this->_file)._data);
        format<std::__cxx11::string>(__return_storage_ptr__,&local_70,&local_50);
        __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                    std::__cxx11::string::~string);
      }
      pbVar3 = (this->_lines).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      std::
      __sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                ((this->_lines).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      AtomicFile::truncate(&file,(char *)pbVar3,__length);
      pbVar1 = (this->_lines).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar3 = (this->_lines).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar1; pbVar3 = pbVar3 + 1
          ) {
        std::operator+(&local_70,pbVar3,'\n');
        AtomicFile::write_raw(&file,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
      }
      this->_dirty = false;
    }
    AtomicFile::~AtomicFile(&file);
  }
  return;
}

Assistant:

void Datafile::commit ()
{
  // The _dirty flag indicates that the file needs to be written.
  if (_dirty)
  {
    AtomicFile file (_file);
    if (! _lines.empty ())
    {
      if (file.open ())
      {
        // Sort the intervals by ascending start time.
        std::sort (_lines.begin (), _lines.end ());

        // Write out all the lines.
        file.truncate ();
        for (auto& line : _lines)
        {
          file.write_raw (line + '\n');
        }

        _dirty = false;
      }
      else
      {
        throw format ("Could not write to data file {1}", _file._data);
      }
    }
    else
    {
      file.remove ();
    }
  }
}